

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O2

void __thiscall
libDAI::RegionGraph::RegionGraph
          (RegionGraph *this,FactorGraph *fg,
          vector<libDAI::Region,_std::allocator<libDAI::Region>_> *ors,
          vector<libDAI::Region,_std::allocator<libDAI::Region>_> *irs,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *edges)

{
  BipRegGraph *this_00;
  _Rb_tree_header *p_Var1;
  vector<libDAI::Region,_std::allocator<libDAI::Region>_> *this_01;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this_02;
  pointer pFVar2;
  bool bVar3;
  mapped_type_conflict *pmVar4;
  long lVar5;
  pointer pRVar6;
  pointer __x;
  size_t alpha;
  ulong uVar7;
  FRegion local_a8;
  TFactor<double> local_68;
  
  (this->super_GraphicalModel)._normType = NORMPROB;
  (this->super_GraphicalModel)._vptr_GraphicalModel = (_func_int **)&PTR__RegionGraph_0061eaa0;
  FactorGraph::FactorGraph(&this->_fg,fg);
  this_00 = &this->_rg;
  p_Var1 = &(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->_fac2OR)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._V1.super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._V2.super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._V2.super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rg)._V2.super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rg)._E12.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_fac2OR)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
            (&this_00->_V1,
             ((long)(ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x28);
  for (pRVar6 = (ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pRVar6 != (ors->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>)._M_impl.
                super__Vector_impl_data._M_finish; pRVar6 = pRVar6 + 1) {
    TFactor<double>::TFactor(&local_68,&pRVar6->super_VarSet,1.0);
    TFactor<double>::TFactor(&local_a8.super_Factor,&local_68);
    local_a8._c = 1.0;
    std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::emplace_back<libDAI::FRegion>
              (&this_00->_V1,&local_a8);
    TFactor<double>::~TFactor(&local_a8.super_Factor);
    TFactor<double>::~TFactor(&local_68);
  }
  local_a8.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    if ((pointer)(((long)(this->_fg)._fg._V2.
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_fg)._fg._V2.
                        super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38) <=
        local_a8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start) {
      RecomputeORs(this);
      this_01 = &(this->_rg)._V2;
      std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
                (this_01,((long)(irs->
                                super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>)
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(irs->
                               super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                               _M_impl.super__Vector_impl_data._M_start) / 0x28);
      for (pRVar6 = (irs->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar6 != (irs->super__Vector_base<libDAI::Region,_std::allocator<libDAI::Region>_>).
                    _M_impl.super__Vector_impl_data._M_finish; pRVar6 = pRVar6 + 1) {
        std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::push_back(this_01,pRVar6);
      }
      this_02 = &(this->_rg)._E12;
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::reserve(this_02,(long)(edges->
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(edges->
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4);
      for (__x = (edges->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
          __x != (edges->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back(this_02,__x);
      }
      BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate(this_00);
      Check_Counting_Numbers(this);
      return;
    }
    lVar5 = 0;
    for (uVar7 = 0;
        pFVar2 = (this->_rg)._V1.
                 super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->_rg)._V1.
                              super__Vector_base<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 6);
        uVar7 = uVar7 + 1) {
      bVar3 = VarSet::includes((VarSet *)((long)&(pFVar2->super_Factor)._vs + lVar5),
                               &(this->_fg)._fg._V2.
                                super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [(long)local_a8.super_Factor._vs._vars.
                                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                       ._M_impl.super__Vector_impl_data._M_start]._vs);
      if (bVar3) {
        pmVar4 = std::
                 map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[](&this->_fac2OR,(key_type *)&local_a8);
        *pmVar4 = uVar7;
        break;
      }
      lVar5 = lVar5 + 0x40;
    }
    local_a8.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&(local_a8.super_Factor._vs._vars.
                           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                           super__Vector_impl_data._M_start)->_label + 1);
  } while( true );
}

Assistant:

RegionGraph::RegionGraph(const FactorGraph & fg, const std::vector<Region> & ors, const std::vector<Region> & irs, const std::vector<R_edge_t> & edges) : GraphicalModel(), _fg(fg), _rg(), _fac2OR() {
        // Copy outer regions (giving them counting number 1.0)
        ORs().reserve( ors.size() );
        for( vector<Region>::const_iterator alpha = ors.begin(); alpha != ors.end(); alpha++ )
            ORs().push_back( FRegion(Factor(*alpha, 1.0), 1.0) );

        // For each factor, find an outer regions that subsumes that factor.
        // Then, multiply the outer region with that factor.
        for( size_t I = 0; I < _fg.nrFactors(); I++ ) {
            size_t alpha;
            for( alpha = 0; alpha < nr_ORs(); alpha++ )
                if( OR(alpha).vars() >> _fg.factor(I).vars() ) {
                    _fac2OR[I] = alpha;
                    break;
                }
            assert( alpha != nr_ORs() );
        }
        RecomputeORs();
        
        // Copy inner regions
        IRs().reserve( irs.size() );
        for( vector<Region>::const_iterator beta = irs.begin(); beta != irs.end(); beta++ )
            IRs().push_back( *beta );
        
        // Copy edges
        Redges().reserve( edges.size() );
        for( vector<R_edge_t>::const_iterator e = edges.begin(); e != edges.end(); e++ )
            Redges().push_back( *e );
        
        // Regenerate BipartiteGraph internals
        _rg.Regenerate();

        // Check counting numbers
        Check_Counting_Numbers();
    }